

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DP.c
# Opt level: O3

void pnga_copy_patch_dp(char *t_a,Integer g_a,Integer ailo,Integer aihi,Integer ajlo,Integer ajhi,
                       Integer g_b,Integer bilo,Integer bihi,Integer bjlo,Integer bjhi)

{
  long lVar1;
  long lVar2;
  byte bVar3;
  undefined8 *ptr;
  Integer IVar4;
  long lVar5;
  undefined8 *puVar6;
  long lVar7;
  undefined8 *puVar8;
  long lVar9;
  undefined8 *puVar10;
  Integer IVar11;
  bool bVar12;
  Integer ld;
  Integer hi [2];
  Integer lo [2];
  Integer btype;
  Integer ndim;
  Integer atype;
  Integer dims [2];
  undefined8 *local_a8;
  Integer local_a0;
  Integer local_98;
  long local_90;
  long local_88;
  long local_80;
  long local_78;
  long local_70;
  long local_68;
  long local_60;
  Integer local_58;
  long local_50;
  long local_48;
  long local_40;
  
  local_a0 = pnga_nodeid();
  local_a8 = (undefined8 *)0x0;
  pnga_check_handle(g_a,"pnga_copy_patch_dp");
  pnga_check_handle(g_b,"pnga_copy_patch_dp");
  local_98 = g_a;
  pnga_inquire(g_a,&local_50,&local_58,&local_48);
  lVar1 = local_48;
  local_68 = local_40;
  pnga_inquire(g_b,&local_60,&local_58,&local_48);
  if ((local_50 != 0x3ec) || (local_60 != 0x3ec)) {
    pnga_error("pnga_copy_patch_dp: wrong types ",0);
  }
  if ((((ailo < 1) || (ajlo < 1)) || (lVar1 < aihi)) || (local_68 < ajhi)) {
    pnga_error(" pnga_copy_patch_dp: g_a indices out of range ",0);
  }
  if (((bilo < 1) || (bjlo < 1)) || ((local_48 < bihi || (local_40 < bjhi)))) {
    pnga_error(" pnga_copy_patch_dp: g_b indices out of range ",0);
  }
  if ((bihi - bilo != aihi - ailo) || (bjhi - bjlo != ajhi - ajlo)) {
    pnga_error(" pnga_copy_patch_dp: shapes two of patches do not match ",0);
  }
  bVar3 = *t_a;
  pnga_distribution(local_98,local_a0,&local_78,&local_88);
  if (((local_70 <= local_80 && (local_78 <= local_88 && (ajlo <= ajhi && ailo <= aihi))) &&
      (ailo <= local_88 && local_78 <= aihi)) && (ajlo <= local_80 && local_70 <= ajhi)) {
    IVar11 = local_78;
    if (local_78 <= ailo) {
      IVar11 = ailo;
    }
    if (local_88 < aihi) {
      aihi = local_88;
    }
    IVar4 = local_70;
    if (local_70 <= ajlo) {
      IVar4 = ajlo;
    }
    if (local_80 < ajhi) {
      ajhi = local_80;
    }
    pnga_access_ptr(local_98,&local_78,&local_88,&local_a8,&local_90);
    if ((bVar3 & 0xdf) == 0x4e) {
      local_78 = IVar11 + (bilo - ailo);
      local_88 = aihi + (bilo - ailo);
      local_70 = IVar4 + (bjlo - ajlo);
      local_80 = ajhi + (bjlo - ajlo);
      ptr = (undefined8 *)0x0;
    }
    else {
      lVar1 = (aihi - IVar11) + 1;
      lVar5 = ajhi - IVar4;
      lVar2 = lVar5 + 1;
      local_a0 = aihi;
      ptr = (undefined8 *)pnga_malloc(lVar2 * lVar1,0x3f5,"copypatch_dp");
      if (-1 < lVar5) {
        puVar6 = ptr;
        lVar7 = 0;
        puVar10 = local_a8;
        do {
          if (-1 < aihi - IVar11) {
            lVar9 = 0;
            puVar8 = puVar6;
            do {
              *puVar8 = puVar10[lVar9];
              lVar9 = lVar9 + 1;
              puVar8 = puVar8 + lVar2;
            } while (lVar1 != lVar9);
          }
          puVar6 = puVar6 + 1;
          puVar10 = puVar10 + local_90;
          bVar12 = lVar7 != lVar5;
          lVar7 = lVar7 + 1;
        } while (bVar12);
      }
      pnga_release(local_98,&local_78,&local_88);
      local_78 = IVar4 + (bilo - ajlo);
      local_88 = ajhi + (bilo - ajlo);
      local_70 = IVar11 + (bjlo - ailo);
      local_80 = local_a0 + (bjlo - ailo);
      local_a8 = ptr;
      local_90 = lVar2;
    }
    pnga_put(g_b,&local_78,&local_88,local_a8,&local_90);
    if ((bVar3 & 0xdf) != 0x4e) {
      pnga_free(ptr);
    }
  }
  return;
}

Assistant:

void pnga_copy_patch_dp(t_a, g_a, ailo, aihi, ajlo, ajhi,
                   g_b, bilo, bihi, bjlo, bjhi)
     Integer g_a, ailo, aihi, ajlo, ajhi;
     Integer g_b, bilo, bihi, bjlo, bjhi;
     char *t_a;
{
Integer atype, btype, adim1, adim2, bdim1, bdim2;
Integer ilos, ihis, jlos, jhis;
Integer ilod, ihid, jlod, jhid, corr, nelem;
Integer me= pnga_nodeid(), ld, i,j;
Integer lo[2], hi[2];
Integer ldT;
char transp;
DoublePrecision *dbl_ptrA=NULL, *dbl_ptrB=NULL;
Integer ndim, dims[2];

   pnga_check_handle(g_a, "pnga_copy_patch_dp");
   pnga_check_handle(g_b, "pnga_copy_patch_dp");

   /* if(g_a == g_b) pnga_error("pnga_copy_patch_dp: arrays have to different ", 0L); */

   pnga_inquire(g_a, &atype, &ndim, dims);
   adim1 = dims[0];
   adim2 = dims[1];
   pnga_inquire(g_b, &btype, &ndim, dims);
   bdim1 = dims[0];
   bdim2 = dims[1];

   if(atype != btype || (atype != C_DBL ))
      pnga_error("pnga_copy_patch_dp: wrong types ", 0L);

   /* check if patch indices and dims match */
   if (ailo <= 0 || aihi > adim1 || ajlo <= 0 || ajhi > adim2)
       pnga_error(" pnga_copy_patch_dp: g_a indices out of range ", 0L);
   if (bilo <= 0 || bihi > bdim1 || bjlo <= 0 || bjhi > bdim2)
       pnga_error(" pnga_copy_patch_dp: g_b indices out of range ", 0L);

   /* check if numbers of elements in two patches match each other */
   if (((bihi - bilo + 1)  != (aihi - ailo + 1)) || 
      ( (bjhi - bjlo + 1)  != (ajhi - ajlo + 1)) )
       pnga_error(" pnga_copy_patch_dp: shapes two of patches do not match ", 0L);

    /* is transpose operation required ? */
   transp = (*t_a == 'n' || *t_a =='N')? 'n' : 't';

   /* now find out cordinates of a patch of g_a that I own */
   pnga_distribution(g_a, me, lo, hi);
   ilos = lo[0];
   jlos = lo[1];
   ihis = hi[0];
   jhis = hi[1];

   if(patch_intersect(ailo, aihi, ajlo, ajhi, &ilos, &ihis, &jlos, &jhis)){
      pnga_access_ptr(g_a, lo, hi, &dbl_ptrA, &ld);
      
      nelem = (ihis-ilos+1)*(jhis-jlos+1);
      
      if ( transp == 'n' ) {
	  corr  = bilo - ailo;
	  ilod  = ilos + corr; 
	  ihid  = ihis + corr;
	  corr  = bjlo - ajlo;
	  jlod  = jlos + corr; 
	  jhid  = jhis + corr;
      } else {
	/* If this is a transpose copy, we need local scratch space */
	dbl_ptrB = (DoublePrecision*) pnga_malloc(nelem,MT_F_DBL,"copypatch_dp");

	  /* Copy from the source into this local array, transposed */
	  ldT = jhis-jlos+1;
	  
	  for(j=0; j< jhis-jlos+1; j++)
	      for(i=0; i< ihis-ilos+1; i++)
		  *(dbl_ptrB + i*ldT + j) = *(dbl_ptrA + j*ld + i);

	  /* Now we can reset index to point to the transposed stuff */
      pnga_release(g_a, lo, hi);
	  dbl_ptrA = dbl_ptrB;
	  ld = ldT;

	  /* And finally, figure out what the destination indices are */
	  corr  = bilo - ajlo;
	  ilod  = jlos + corr; 
	  ihid  = jhis + corr;
	  corr  = bjlo - ailo;
	  jlod  = ilos + corr; 
	  jhid  = ihis + corr;
      }
	  
      /* Put it where it belongs */
      lo[0] = ilod;
      lo[1] = jlod;
      hi[0] = ihid;
      hi[1] = jhid;
      pnga_put(g_b, lo, hi, dbl_ptrA, &ld);

      /* Get rid of local memory if we used it */
      if( transp == 't') pnga_free(dbl_ptrB);
  }
}